

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_false,_true>::move_
          (DaTrie<false,_false,_true> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query)

{
  size_t sVar1;
  Bc BVar2;
  uint8_t *puVar3;
  pointer pBVar4;
  uint node_pos_00;
  uint node_pos_01;
  Bc BVar5;
  size_t sVar6;
  ulong uVar7;
  uint8_t *__begin2;
  Edge src_edge;
  Edge local_138;
  
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar5 = pBVar4[node_pos];
  sVar1 = edge->size_;
  if (sVar1 != 0) {
    puVar3 = edge->labels_;
    do {
      node_pos_01 = BVar5._0_4_ & 0x7fffffff ^ (uint)edge->labels_[0];
      node_pos_00 = edge->labels_[0] ^ base;
      fix_(this,node_pos_00,&this->blocks_);
      pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar4[node_pos_00] = pBVar4[node_pos_01];
      memset(&local_138,0,0x108);
      edge_(this,node_pos_01,&local_138,0x100);
      if (local_138.size_ != 0) {
        BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[node_pos_01];
        sVar6 = 0;
        do {
          uVar7 = (ulong)local_138.labels_[sVar6] ^ (ulong)(BVar2._0_4_ & 0x7fffffff);
          pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar4[uVar7] =
               (Bc)((ulong)pBVar4[uVar7] & 0x80000000ffffffff |
                   (ulong)(node_pos_00 & 0x7fffffff) << 0x20);
          sVar6 = sVar6 + 1;
        } while (local_138.size_ != sVar6);
      }
      unfix_(this,node_pos_01,&this->blocks_);
      if (node_pos_01 == query->node_pos_) {
        query->node_pos_ = node_pos_00;
      }
      edge = (Edge *)(edge->labels_ + 1);
    } while (edge != (Edge *)(puVar3 + sVar1));
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar5 = pBVar4[node_pos];
  }
  pBVar4[node_pos] = (Bc)((ulong)(base & 0x7fffffff) | (ulong)BVar5 & 0xffffffff00000000);
  return;
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }